

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.h
# Opt level: O2

DynamicType ** __thiscall
Memory::AllocateArray<Memory::Recycler,Js::DynamicType*,false>
          (Memory *this,Recycler *allocator,AllocFuncType AllocFunc,size_t count)

{
  DynamicType **ppDVar1;
  
  if (count != 0) {
    ppDVar1 = (DynamicType **)
              new__<Memory::Recycler>
                        (-(ulong)(count >> 0x3d != 0) | count << 3,(Recycler *)this,
                         (offset_in_Recycler_to_subr)allocator);
    return ppDVar1;
  }
  Recycler::ClearTrackAllocInfo((Recycler *)this,(TrackAllocData *)0x0);
  return (DynamicType **)0x8;
}

Assistant:

inline T * AllocateArray(TAllocator * allocator, char * (TAllocator::*AllocFunc)(size_t), DECLSPEC_GUARD_OVERFLOW size_t count)
{
    if (count == 0 && TAllocator::FakeZeroLengthArray)
    {
#ifdef TRACK_ALLOC
        allocator->ClearTrackAllocInfo();
#endif
        // C++ standard requires allocator to return non-null if it isn't out of memory
        // Just return some small number so we will still AV if someone try to use the memory
        return (T *)ZERO_LENGTH_ARRAY;
    }
    if (nothrow)
    {
        return new (allocator, nothrow, AllocFunc) T[count];
    }
    return new (allocator, AllocFunc) T[count];
}